

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int ptls_receive(ptls_t *tls,ptls_buffer_t *decryptbuf,void *_input,size_t *inlen)

{
  size_t *psVar1;
  uint8_t *puVar2;
  uint64_t *puVar3;
  size_t sVar4;
  ulong uVar5;
  st_ptls_aead_context_t *psVar6;
  ptls_buffer_t *ppVar7;
  uint8_t uVar8;
  int iVar9;
  size_t sVar10;
  long lVar11;
  undefined1 *puVar12;
  uint8_t *end;
  ulong uVar13;
  size_t consumed;
  uint64_t nonce;
  uint8_t *src;
  st_ptls_record_t rec;
  undefined1 local_8d [8];
  uint8_t local_85;
  undefined2 local_84;
  undefined1 local_82;
  undefined1 local_81;
  size_t local_80;
  size_t local_78;
  uint64_t local_70;
  uint8_t *local_68;
  uint8_t *local_60;
  ptls_buffer_t *local_58;
  size_t *local_50;
  st_ptls_record_t local_48;
  
  if (tls->state < PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) {
    __assert_fail("tls->state >= PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                  0x17c7,"int ptls_receive(ptls_t *, ptls_buffer_t *, const void *, size_t *)");
  }
  puVar2 = (uint8_t *)((long)_input + *inlen);
  iVar9 = 0;
  if ((*inlen != 0) && (sVar4 = decryptbuf->off, sVar4 == decryptbuf->off)) {
    local_58 = &(tls->recvbuf).rec;
    local_50 = inlen;
    do {
      local_80 = (long)puVar2 - (long)_input;
      if (((tls->traffic_protection).dec.field_0x58 & 1) == 0) {
        iVar9 = handle_input(tls,(ptls_message_emitter_t *)0x0,decryptbuf,_input,&local_80,
                             (ptls_handshake_properties_t *)0x0);
      }
      else {
        iVar9 = parse_record(tls,&local_48,(uint8_t *)_input,&local_80);
        if (iVar9 == 0) {
          if (local_48.fragment == (uint8_t *)0x0) {
            __assert_fail("rec.fragment != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                          ,0x1743,
                          "int handle_input_tls12(ptls_t *, ptls_buffer_t *, const void *, size_t *)"
                         );
          }
          local_68 = local_48.fragment;
          end = local_48.fragment + local_48.length;
          sVar10 = (((tls->traffic_protection).dec.aead)->algo->tls12).record_iv_size;
          if (sVar10 == 0) {
            local_70 = (tls->traffic_protection).dec.seq;
LAB_001144ce:
            uVar8 = local_48.type;
            uVar13 = (long)end - (long)local_68;
            psVar1 = &((tls->traffic_protection).dec.aead)->algo->tag_size;
            if (*psVar1 <= uVar13) {
              local_60 = local_68;
              uVar5 = (tls->traffic_protection).dec.seq;
              lVar11 = 0x38;
              puVar12 = local_8d;
              local_78 = uVar13 - *psVar1;
              do {
                *puVar12 = (char)(uVar5 >> ((byte)lVar11 & 0x3f));
                lVar11 = lVar11 + -8;
                puVar12 = puVar12 + 1;
              } while (lVar11 != -8);
              local_85 = uVar8;
              local_84 = 0x303;
              local_82 = (undefined1)(local_78 >> 8);
              local_81 = (undefined1)local_78;
              iVar9 = ptls_buffer_reserve_aligned(decryptbuf,local_78,'\0');
              if (((iVar9 == 0) &&
                  (psVar6 = (tls->traffic_protection).dec.aead,
                  sVar10 = (*psVar6->do_decrypt)
                                     (psVar6,decryptbuf->base + decryptbuf->off,local_60,uVar13,
                                      local_70,local_8d,0xd), sVar10 == local_78)) &&
                 (puVar3 = &(tls->traffic_protection).dec.seq, *puVar3 = *puVar3 + 1,
                 uVar8 == '\x17')) {
                decryptbuf->off = decryptbuf->off + local_78;
              }
            }
          }
          else {
            if (sVar10 != 8) {
              __assert_fail("tls->traffic_protection.dec.aead->algo->tls12.record_iv_size == 8",
                            "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                            ,0x174b,
                            "int handle_input_tls12(ptls_t *, ptls_buffer_t *, const void *, size_t *)"
                           );
            }
            iVar9 = ptls_decode64(&local_70,&local_68,end);
            if (iVar9 == 0) goto LAB_001144ce;
          }
          ppVar7 = local_58;
          ptls_buffer__release_memory(local_58);
          ppVar7->off = 0;
          ppVar7->is_allocated = '\0';
          ppVar7->align_bits = '\0';
          *(undefined6 *)&ppVar7->field_0x1a = 0;
          ppVar7->base = (uint8_t *)0x0;
          ppVar7->capacity = 0;
          (*ptls_clear_memory)(local_8d,0xd);
          iVar9 = 0;
          inlen = local_50;
        }
      }
      _input = (void *)((long)_input + local_80);
      if (iVar9 == 0x202) {
        iVar9 = 0;
      }
    } while (((iVar9 == 0) && ((uint8_t *)_input != puVar2)) && (sVar4 == decryptbuf->off));
  }
  *inlen = (size_t)((long)_input + (*inlen - (long)puVar2));
  return iVar9;
}

Assistant:

int ptls_receive(ptls_t *tls, ptls_buffer_t *decryptbuf, const void *_input, size_t *inlen)
{
    const uint8_t *input = (const uint8_t *)_input, *const end = input + *inlen;
    size_t decryptbuf_orig_size = decryptbuf->off;
    int ret = 0;

    assert(tls->state >= PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA);

    /* loop until we decrypt some application data (or an error) */
    while (ret == 0 && input != end && decryptbuf_orig_size == decryptbuf->off) {
        size_t consumed = end - input;
        if (tls->traffic_protection.dec.tls12) {
            ret = handle_input_tls12(tls, decryptbuf, input, &consumed);
        } else {
            ret = handle_input(tls, NULL, decryptbuf, input, &consumed, NULL);
        }
        input += consumed;

        switch (ret) {
        case 0:
            break;
        case PTLS_ERROR_IN_PROGRESS:
            ret = 0;
            break;
        case PTLS_ERROR_CLASS_PEER_ALERT + PTLS_ALERT_CLOSE_NOTIFY:
            /* TODO send close alert */
            break;
        default:
            if (PTLS_ERROR_GET_CLASS(ret) == PTLS_ERROR_CLASS_SELF_ALERT) {
                /* TODO send alert */
            }
            break;
        }
    }

    *inlen -= end - input;

    return ret;
}